

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O1

void __thiscall cluster_info_t::Reset(cluster_info_t *this)

{
  this->cluster = 0;
  FString::operator=(&this->FinaleFlat,(char *)"");
  FString::operator=(&this->ExitText,(char *)"");
  FString::operator=(&this->EnterText,(char *)"");
  FString::operator=(&this->MessageMusic,(char *)"");
  this->musicorder = 0;
  this->flags = 0;
  this->cdtrack = 0;
  FString::operator=(&this->ClusterName,(char *)"");
  this->cdid = 0;
  return;
}

Assistant:

void cluster_info_t::Reset()
{
	cluster = 0;
	FinaleFlat = "";
	ExitText = "";
	EnterText = "";
	MessageMusic = "";
	musicorder = 0;
	flags = 0;
	cdtrack = 0;
	ClusterName = "";
	cdid = 0;
}